

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ntestc.cc
# Opt level: O0

int main(int argc,char **argv)

{
  double *pdVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char msg_1 [100];
  int p;
  char msg [100];
  int locdim [4];
  double *ptr;
  GlobalArray *g_b;
  GlobalArray *g_a;
  int stack;
  int heap;
  double *buf;
  int *map;
  patch_t *regions;
  int type;
  int ndim;
  int adims [4];
  int offset;
  int *proclist;
  int d;
  int i;
  int ld [3];
  int block [4];
  int hi [4];
  int lo [4];
  int dims [4];
  int loop;
  int proc;
  int nproc;
  int me;
  int *in_stack_fffffffffffffe18;
  GlobalArray *g_a_00;
  undefined4 in_stack_fffffffffffffe20;
  int in_stack_fffffffffffffe24;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  GlobalArray *in_stack_fffffffffffffe30;
  char **in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  GAServices *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffe58;
  int in_stack_fffffffffffffe5c;
  GAServices *in_stack_fffffffffffffe60;
  int *in_stack_fffffffffffffe70;
  char local_168 [112];
  int local_f8 [6];
  GlobalArray *local_e0;
  GlobalArray *local_d8;
  undefined4 local_d0;
  undefined4 local_cc;
  void *local_c8;
  GlobalArray *local_c0;
  void *local_b8;
  int local_ac;
  int local_a8 [7];
  uint local_8c;
  void *local_88;
  int local_7c;
  uint local_78;
  int local_74 [7];
  int local_58 [4];
  int local_48 [4];
  int local_38 [6];
  int local_20;
  int local_1c;
  int local_18;
  uint local_14;
  int local_4;
  
  local_4 = 0;
  local_cc = 3000000;
  local_d0 = 3000000;
  GA::Initialize(in_stack_fffffffffffffe44,in_stack_fffffffffffffe38,
                 (unsigned_long)in_stack_fffffffffffffe30,
                 CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 in_stack_fffffffffffffe24,(size_t)in_stack_fffffffffffffe18);
  local_14 = GA_Nodeid();
  local_18 = GA_Nnodes();
  if (local_14 == 0) {
    printf("Creating array A\n");
    fflush(_stdout);
  }
  for (local_78 = 0; (int)local_78 < 4; local_78 = local_78 + 1) {
    local_38[(int)local_78] = (local_78 + 1) * 10;
  }
  local_d8 = GA::GAServices::createGA
                       (in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                        in_stack_fffffffffffffe48,
                        (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        (char *)in_stack_fffffffffffffe38,&in_stack_fffffffffffffe30->mHandle);
  if (local_14 == 0) {
    printf("OK\n\n");
  }
  if (local_14 == 0) {
    uVar2 = GA::GlobalArray::handle(local_d8);
    printf("handle = %d\n",(ulong)uVar2);
  }
  GA::GlobalArray::inquire
            (in_stack_fffffffffffffe30,
             (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
             (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             in_stack_fffffffffffffe18);
  if (local_14 == 0) {
    printf("After Inquire\n");
  }
  GA::GlobalArray::printDistribution((GlobalArray *)0x103ad4);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (local_14 == 0) {
    printf("\nReconstructing distribution description for A\n");
  }
  local_88 = malloc((long)local_18 << 2);
  if (local_88 == (void *)0x0) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  }
  local_b8 = malloc((long)local_18 << 5);
  if (local_b8 == (void *)0x0) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  }
  local_c0 = (GlobalArray *)malloc((long)(local_18 + local_ac) << 2);
  if (local_c0 == (GlobalArray *)0x0) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  }
  for (local_78 = 0; (int)local_78 < local_ac; local_78 = local_78 + 1) {
    local_48[(int)local_78] = 0;
  }
  for (local_78 = 0; (int)local_78 < local_ac; local_78 = local_78 + 1) {
    local_58[(int)local_78] = local_a8[(int)local_78] + -1;
  }
  local_1c = GA::GlobalArray::locateRegion
                       (in_stack_fffffffffffffe30,
                        (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                        (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                        in_stack_fffffffffffffe18,(int *)0x103c57);
  if (local_1c < 1) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)in_stack_fffffffffffffe18 >> 0x20));
  }
  for (local_78 = 0; (int)local_78 < local_ac; local_78 = local_78 + 1) {
    local_74[(long)(int)local_78 + 3] = 0;
  }
  for (local_78 = 0; (int)local_78 < local_ac; local_78 = local_78 + 1) {
    local_a8[(int)local_78] = 0;
  }
  local_8c = 0;
  for (local_7c = 0; local_7c < local_ac; local_7c = local_7c + 1) {
    for (local_78 = 0; (int)local_78 < local_1c; local_78 = local_78 + 1) {
      if (local_a8[local_7c] <
          *(int *)((long)local_b8 + (long)local_7c * 4 + (long)(int)local_78 * 0x20 + 0x10)) {
        local_c0[(int)local_8c].mHandle =
             *(int *)((long)local_b8 + (long)local_7c * 4 + (long)(int)local_78 * 0x20);
        local_8c = local_8c + 1;
        local_74[(long)local_7c + 3] = local_74[(long)local_7c + 3] + 1;
        local_a8[local_7c] =
             *(int *)((long)local_b8 + (long)local_7c * 4 + (long)(int)local_78 * 0x20 + 0x10);
      }
    }
  }
  if (local_14 == 0) {
    printf("Distribution map contains %d elements\n",(ulong)local_8c);
    print_subscript((char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                    (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    (char *)in_stack_fffffffffffffe18);
    print_subscript((char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                    (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                    (char *)in_stack_fffffffffffffe18);
    fflush(_stdout);
  }
  if (local_14 == 0) {
    printf("Creating array B applying distribution of A\n");
  }
  g_a_00 = local_c0;
  local_e0 = GA::GAServices::createGA
                       (in_stack_fffffffffffffe60,in_stack_fffffffffffffe5c,
                        in_stack_fffffffffffffe58,(int *)in_stack_fffffffffffffe50,
                        (char *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        (int *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40),
                        in_stack_fffffffffffffe70);
  if (local_e0 == (GlobalArray *)0x0) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)g_a_00 >> 0x20));
  }
  if (local_14 == 0) {
    printf("OK\n\n");
  }
  free(local_88);
  free(local_b8);
  free(local_c0);
  GA::GlobalArray::printDistribution((GlobalArray *)0x103f6f);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (local_14 == 0) {
    printf("\nCompare distributions of A and B\n");
    iVar3 = GA::GlobalArray::compareDistr
                      ((GlobalArray *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                       g_a_00);
    if (iVar3 == 0) {
      printf("Success: distributions identical\n");
    }
    else {
      printf("Failure: distributions NOT identical\n");
    }
    fflush(_stdout);
  }
  if (local_14 == 0) {
    printf("\nAccessing local elements of A: set them to the owner process id\n");
    fflush(_stdout);
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  GA::GlobalArray::distribution
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
             (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),&g_a_00->mHandle);
  if (-1 < local_58[0]) {
    GA::GlobalArray::access(local_d8,(char *)local_48,(int)local_58);
    for (local_78 = 0; (int)local_78 < local_ac; local_78 = local_78 + 1) {
      local_f8[(int)local_78] = (local_58[(int)local_78] - local_48[(int)local_78]) + 1;
    }
    fillPatch((double *)in_stack_fffffffffffffe60,
              (int *)CONCAT44(in_stack_fffffffffffffe5c,in_stack_fffffffffffffe58),
              (int *)in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
              (double)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  }
  for (local_78 = 0; (int)local_78 < local_18; local_78 = local_78 + 1) {
    if ((local_14 == local_78) && (-1 < local_58[0])) {
      sprintf(local_168,"%d: leading dimensions",(ulong)local_14);
      print_subscript((char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                      (int *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
                      (char *)g_a_00);
      fflush(_stdout);
    }
    GA::GAServices::sync((GAServices *)&GA::SERVICES);
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (local_14 == 0) {
    printf("\nRandomly checking the update using ga_get on array sections\n");
  }
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  srand(local_14);
  local_58[local_ac + -1] = local_a8[local_ac + -1] + -1;
  for (local_78 = 1; (int)local_78 < local_ac + -1; local_78 = local_78 + 1) {
    local_74[(int)local_78] = 1;
  }
  local_74[local_ac + -2] = local_a8[local_ac + -1] + -1;
  local_c8 = malloc((long)local_a8[local_ac + -1] << 3);
  if (local_c8 == (void *)0x0) {
    GA_Error((char *)CONCAT44(in_stack_fffffffffffffe24,in_stack_fffffffffffffe20),
             (int)((ulong)g_a_00 >> 0x20));
  }
  uVar2 = local_14;
  if ((int)local_14 <= local_18 / 2) {
    for (local_20 = 0; local_20 < 10; local_20 = local_20 + 1) {
      local_48[local_ac + -1] = 0;
      for (local_78 = 0; (int)local_78 < local_ac + -1; local_78 = local_78 + 1) {
        iVar3 = rand();
        local_58[(int)local_78] = iVar3 % local_a8[(int)local_78];
        local_48[(int)local_78] = iVar3 % local_a8[(int)local_78];
      }
      GA::GlobalArray::get
                (in_stack_fffffffffffffe30,
                 (int *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28),
                 (int *)CONCAT44(uVar2,in_stack_fffffffffffffe20),g_a_00,(int *)0x1043aa);
      for (local_78 = 0; (int)local_78 < local_a8[local_ac + -1]; local_78 = local_78 + 1) {
        uVar4 = GA::GlobalArray::locate
                          ((GlobalArray *)CONCAT44(uVar2,in_stack_fffffffffffffe20),&g_a_00->mHandle
                          );
        pdVar1 = (double *)((long)local_c8 + (long)(int)local_78 * 8);
        if (((double)(int)uVar4 != *pdVar1) || (NAN((double)(int)uVar4) || NAN(*pdVar1))) {
          sprintf(&stack0xfffffffffffffe28,"%d: wrong value: %d != %f a",
                  *(undefined8 *)((long)local_c8 + (long)(int)local_78 * 8),(ulong)local_14,
                  (ulong)uVar4);
          print_subscript((char *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c,
                          (int *)CONCAT44(uVar2,in_stack_fffffffffffffe20),(char *)g_a_00);
          GA_Error((char *)CONCAT44(uVar2,in_stack_fffffffffffffe20),(int)((ulong)g_a_00 >> 0x20));
        }
        local_48[local_ac + -1] = local_48[local_ac + -1] + 1;
      }
    }
  }
  free(local_c8);
  GA::GAServices::sync((GAServices *)&GA::SERVICES);
  if (local_14 == 0) {
    printf("OK\n");
  }
  GA::GlobalArray::destroy((GlobalArray *)CONCAT44(uVar2,in_stack_fffffffffffffe20));
  GA::GlobalArray::destroy((GlobalArray *)CONCAT44(uVar2,in_stack_fffffffffffffe20));
  if (local_14 == 0) {
    std::operator<<((ostream *)&std::cout,"Terminating\n");
  }
  GA::Terminate();
  return local_4;
}

Assistant:

int 
main(int argc, char *argv[]) {
 
  int me, nproc, proc, loop;
  int dims[NDIM], lo[NDIM], hi[NDIM], block[NDIM], ld[NDIM-1];
  int i,d,*proclist, offset;
  int adims[NDIM], ndim,type;
  typedef struct {
    int lo[NDIM];
    int hi[NDIM];
  } patch_t;
  patch_t *regions;
  int *map;
  double *buf;
  int heap  = 3000000, stack = 3000000;
  
  GA::Initialize(argc, argv, heap, stack, GA_DATA_TYPE, 0);
  me=GA_Nodeid(); nproc=GA_Nnodes();


  /***** create array A with default distribution  *****/
  if(me==0){printf("Creating array A\n"); fflush(stdout);}
  for(i = 0; i<NDIM; i++)
    dims[i] = N*(i+1);
  GA::GlobalArray *g_a = GA::SERVICES.createGA(MT_F_DBL, NDIM, dims, 
					       (char *)"array A", NULL);
  if(me==0)printf("OK\n\n");
  if(me==0)printf("handle = %d\n", g_a->handle());
  /* print info about array we got */
  g_a->inquire(&type, &ndim, adims);
  if(me==0)printf("After Inquire\n");
  g_a->printDistribution();

  GA::SERVICES.sync();
  /* duplicate array A with ga_create irreg rather than ga_duplicate
   * -- want to show distribution control 
   * -- with ga_duplicate it would be g_b=GA_Duplicate(g_a,name) 
   */
  if(me==0)printf("\nReconstructing distribution description for A\n");

  /* get memory for arrays describing distribution */
  proclist = (int*)malloc(nproc*sizeof(int));
  if(!proclist)GA_Error((char *)"malloc failed for proclist",0);
  regions = (patch_t*)malloc(nproc*sizeof(patch_t));
  if(!regions)GA_Error((char *)"malloc failed for regions",0);
  map = (int*)malloc((nproc+ndim)*sizeof(int)); /* ubound= nproc+mdim */
  if(!map)GA_Error((char *)"malloc failed for map",0);

  /* first find out how array g_a is distributed */
  for(i=0;i<ndim;i++)lo[i]=BASE;
  for(i=0;i<ndim;i++)hi[i]=adims[i] -1 + BASE;
  proc = g_a->locateRegion(lo, hi, (int*)regions, proclist);
  if(proc<1) GA_Error((char *)"error in NGA_Locate_region",proc);

  /* determine blocking for each dimension */
  for(i=0;i<ndim;i++)block[i]=0;
  for(i=0;i<ndim;i++)adims[i]=0;
     
  offset =0;
  for(d=0; d<ndim; d++)
    for(i=0;i<proc;i++)
      if( regions[i].hi[d]>adims[d] ){
	map[offset] = regions[i].lo[d];
	offset++;
	block[d]++;
	adims[d]= regions[i].hi[d];
      }
            
  if(me==0){
    printf("Distribution map contains %d elements\n",offset); 
    print_subscript((char *)"number of blocks for each dimension",
		    ndim,block,(char *)"\n");
    print_subscript((char *)"distribution map",offset,map,(char *)"\n\n");
    fflush(stdout);
  }
     
  if(me==0)printf("Creating array B applying distribution of A\n");

#    ifdef USE_DUPLICATE
  GA::GlobalArray *g_b = GA::SERVICES.createGA(g_a, "array B");
#    else
  GA::GlobalArray *g_b = GA::SERVICES.createGA(MT_F_DBL, NDIM, dims, 
					       (char *)"array B", block, map);
#    endif
  if(!g_b) GA_Error((char *)"create failed: B",0); 
  if(me==0)printf("OK\n\n");
  free(proclist); free(regions); free(map);
     
  g_b->printDistribution();

  GA::SERVICES.sync();

  if(me==0){
    printf("\nCompare distributions of A and B\n");
    if(g_a->compareDistr(g_b))
      printf("Failure: distributions NOT identical\n");
    else 
      printf("Success: distributions identical\n");
    fflush(stdout);
  }
       

  if(me==0){
    printf("\nAccessing local elements of A: set them to the owner process id\n");
    fflush(stdout);
  }
  GA::SERVICES.sync();

  g_a->distribution(me, lo, hi);

  if(hi[0]>=0){/* -1 means no elements stored on this processor */
    double *ptr;
    int locdim[NDIM];
    g_a->access(lo, hi, &ptr, ld);
    for(i=0;i<ndim;i++)locdim[i]=hi[i]-lo[i]+1;
    fillPatch(ptr, locdim, ld, ndim,(double)me);
  }

  for(i=0;i<nproc; i++){
    if(me==i && hi[0]>=0){
      char msg[100];
      sprintf(msg,(char *)"%d: leading dimensions",me);
      print_subscript(msg,ndim-1,ld,(char *)"\n");
      fflush(stdout);
    }
    GA::SERVICES.sync();
  }
     
  GA::SERVICES.sync();
  if(me==0)printf("\nRandomly checking the update using ga_get on array sections\n");
  GA::SERVICES.sync();

  /* show ga_get working and verify array updates 
   * every process does N random gets
   * for simplicity get only a single row at a time
   */
  srand(me); /* different seed for every process */
  hi[ndim-1]=adims[ndim-1] -1 + BASE;
  for(i=1;i<ndim-1; i++)ld[i]=1; ld[ndim-2]=adims[ndim-1] -1 + BASE;

  /* get buffer memory */
  buf = (double*)malloc(adims[ndim-1]*sizeof(double));
  if(!buf)GA_Error((char *)"malloc failed for buf",0);

  /* half of the processes check the result */
  if(me<=nproc/2) 
    for(loop = 0; loop< N; loop++){ /* task parallel loop */
      lo[ndim-1]=BASE;
      for (i= 0; i < ndim -1; i ++){
	lo[i] = hi[i] = rand()%adims[i]+BASE; 
      }

      /* print_subscript("getting",ndim,lo,"\n");*/
      g_a->get(lo, hi, buf, ld); 
         
      /* check values */
      for(i=0;i<adims[ndim-1]; i++){
	int p = g_a->locate(lo);
	if((double)p != buf[i]) {
	  char msg[100];
	  sprintf(msg,(char *)"%d: wrong value: %d != %f a",me, p, buf[i]);
	  print_subscript(msg,ndim,lo,(char *)"\n");
	  GA_Error((char *)"Error - bye",i);  
	}
	lo[ndim-1]++;
      }
    }
             
  free(buf);
  GA::SERVICES.sync();
           
  if(me==0)printf("OK\n");
     
  g_a->destroy();
  g_b->destroy();
  if(!me) cout << "Terminating\n";
  GA::Terminate();
}